

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmwrtimg.cpp
# Opt level: O0

void __thiscall CVmImageWriter::begin_mhls_block(CVmImageWriter *this)

{
  osfildef *poVar1;
  CVmFile *in_RDI;
  int unaff_retaddr;
  char *in_stack_00000008;
  uint in_stack_ffffffffffffffec;
  
  begin_block(this,in_stack_00000008,unaff_retaddr);
  poVar1 = (osfildef *)CVmFile::get_pos(in_RDI);
  in_RDI[6].fp_ = poVar1;
  CVmFile::write_uint4(in_RDI,in_stack_ffffffffffffffec);
  in_RDI[6].seek_base_ = 0;
  return;
}

Assistant:

void CVmImageWriter::begin_mhls_block()
{
    /* 
     *   begin the block - MHLS blocks are always optional, since they're
     *   purely for debugging purposes 
     */
    begin_block("MHLS", FALSE);

    /* remember where the count goes so we can fix it up later */
    mhls_cnt_pos_ = fp_->get_pos();

    /* write a placehodler count */
    fp_->write_uint4(0);

    /* there are no entries yet */
    mhls_cnt_ = 0;
}